

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  cmTarget *pcVar1;
  bool bVar2;
  cmValue cVar3;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var4;
  undefined7 extraout_var;
  char *pcVar5;
  string *psVar6;
  _Alloc_hider s;
  pointer s_00;
  bool bVar7;
  char local_115;
  undefined4 local_114;
  cmValue *local_110;
  cmTarget *local_108;
  string *local_100;
  string mapProp;
  string locProp;
  string locPropBase;
  cmList mappedConfigs;
  string impProp;
  string config_upper;
  
  config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
  config_upper._M_string_length = 0;
  config_upper.field_2._M_local_buf[0] = '\0';
  local_110 = imp;
  local_100 = suffix;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&locPropBase,desired_config);
    std::__cxx11::string::operator=((string *)&config_upper,(string *)&locPropBase);
    std::__cxx11::string::~string((string *)&locPropBase);
  }
  locPropBase._M_dataplus._M_p = (pointer)&locPropBase.field_2;
  locPropBase._M_string_length = 0;
  locPropBase.field_2._M_local_buf[0] = '\0';
  pcVar5 = "IMPORTED_OBJECTS";
  std::__cxx11::string::assign((char *)&locPropBase);
  locProp._M_dataplus._M_p._0_1_ = 0x5f;
  cmStrCat<char,std::__cxx11::string&>(&mapProp,(char *)&locProp,&config_upper);
  std::__cxx11::string::operator=((string *)local_100,(string *)&mapProp);
  std::__cxx11::string::~string((string *)&mapProp);
  mappedConfigs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappedConfigs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mappedConfigs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmStrCat<char_const(&)[21],std::__cxx11::string&>
            (&mapProp,(char (*) [21])"MAP_IMPORTED_CONFIG_",&config_upper);
  cVar3 = GetProperty(this,&mapProp);
  if (cVar3.Value != (string *)0x0) {
    cmList::assign(&mappedConfigs,cVar3.Value,Yes);
  }
  std::__cxx11::string::~string((string *)&mapProp);
  local_114 = (undefined4)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
  if ((((this->impl)._M_t.
        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
        super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 2) &&
     (bVar2 = IsExecutableWithExports(this), !bVar2)) {
    _Var4._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if ((_Var4._M_head_impl)->IsAIX == true) {
      bVar2 = IsExecutableWithExports(this);
      if (bVar2) goto LAB_0028b550;
      _Var4._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    }
    bVar2 = cmMakefile::PlatformSupportsAppleTextStubs((_Var4._M_head_impl)->Makefile);
    if (bVar2) {
      bVar2 = IsSharedLibraryWithExports(this);
      local_114 = (undefined4)CONCAT71(extraout_var,bVar2);
    }
    else {
      local_114 = 0;
    }
  }
LAB_0028b550:
  s_00 = mappedConfigs.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_108 = this;
  do {
    pcVar1 = local_108;
    bVar2 = true;
    if (loc->Value != (string *)0x0) {
LAB_0028b8ea:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&mappedConfigs.Values);
      std::__cxx11::string::~string((string *)&locPropBase);
      std::__cxx11::string::~string((string *)&config_upper);
      return bVar2;
    }
    psVar6 = local_110->Value;
    if ((psVar6 != (string *)0x0) ||
       (s_00 == mappedConfigs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
      if (mappedConfigs.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          mappedConfigs.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (psVar6 != (string *)0x0) goto LAB_0028b6ec;
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&mapProp,&locPropBase,local_100);
        cVar3 = GetProperty(local_108,&mapProp);
        loc->Value = (string *)cVar3;
        if ((char)local_114 != '\0') {
          cmStrCat<char_const(&)[16],std::__cxx11::string&>
                    (&locProp,(char (*) [16])0x6d4ddc,local_100);
          cVar3 = GetProperty(local_108,&locProp);
          local_110->Value = cVar3.Value;
          std::__cxx11::string::~string((string *)&locProp);
        }
        std::__cxx11::string::~string((string *)&mapProp);
        bVar7 = loc->Value != (string *)0x0;
      }
      else {
        if (psVar6 == (string *)0x0) goto LAB_0028b8db;
LAB_0028b6ec:
        bVar7 = false;
      }
      if ((!bVar7) && (local_110->Value == (string *)0x0)) {
        local_100->_M_string_length = 0;
        *(local_100->_M_dataplus)._M_p = '\0';
        cVar3 = GetProperty(local_108,&locPropBase);
        loc->Value = (string *)cVar3;
        if ((char)local_114 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&mapProp,"IMPORTED_IMPLIB",(allocator<char> *)&locProp);
          cVar3 = GetProperty(local_108,&mapProp);
          local_110->Value = cVar3.Value;
          std::__cxx11::string::~string((string *)&mapProp);
          cVar3 = (cmValue)loc->Value;
        }
        psVar6 = local_110->Value;
        if (psVar6 == (string *)0x0 && cVar3.Value == (string *)0x0) {
          impProp._M_dataplus._M_p = (pointer)0x0;
          impProp._M_string_length = 0;
          impProp.field_2._M_allocated_capacity = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&mapProp,"IMPORTED_CONFIGURATIONS",(allocator<char> *)&locProp);
          cVar3 = GetProperty(local_108,&mapProp);
          std::__cxx11::string::~string((string *)&mapProp);
          if (cVar3.Value != (string *)0x0) {
            cmList::assign((cmList *)&impProp,cVar3.Value,Yes,No);
          }
          psVar6 = local_100;
          for (s._M_p = impProp._M_dataplus._M_p;
              ((loc->Value == (string *)0x0 && (local_110->Value == (string *)0x0)) &&
              (s._M_p != (pointer)impProp._M_string_length)); s._M_p = s._M_p + 0x20) {
            local_115 = '_';
            cmsys::SystemTools::UpperCase(&locProp,(string *)s._M_p);
            cmStrCat<char,std::__cxx11::string>(&mapProp,&local_115,&locProp);
            std::__cxx11::string::operator=((string *)psVar6,(string *)&mapProp);
            std::__cxx11::string::~string((string *)&mapProp);
            std::__cxx11::string::~string((string *)&locProp);
            cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&mapProp,&locPropBase,psVar6);
            cVar3 = GetProperty(local_108,&mapProp);
            loc->Value = (string *)cVar3;
            if ((char)local_114 != '\0') {
              cmStrCat<char_const(&)[16],std::__cxx11::string&>
                        (&locProp,(char (*) [16])0x6d4ddc,local_100);
              cVar3 = GetProperty(local_108,&locProp);
              local_110->Value = cVar3.Value;
              std::__cxx11::string::~string((string *)&locProp);
            }
            std::__cxx11::string::~string((string *)&mapProp);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&impProp);
          cVar3 = (cmValue)loc->Value;
          psVar6 = local_110->Value;
        }
        if (psVar6 == (string *)0x0 && cVar3.Value == (string *)0x0) {
LAB_0028b8db:
          bVar2 = ((local_108->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7
          ;
        }
      }
      goto LAB_0028b8ea;
    }
    if (s_00->_M_string_length == 0) {
      cVar3 = GetProperty(local_108,&locPropBase);
      loc->Value = (string *)cVar3;
      if ((char)local_114 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mapProp,"IMPORTED_IMPLIB",(allocator<char> *)&locProp);
        cVar3 = GetProperty(pcVar1,&mapProp);
        local_110->Value = cVar3.Value;
        std::__cxx11::string::~string((string *)&mapProp);
        cVar3 = (cmValue)loc->Value;
      }
      if (cVar3.Value != (string *)0x0 || local_110->Value != (string *)0x0) {
        local_100->_M_string_length = 0;
        *(local_100->_M_dataplus)._M_p = '\0';
      }
    }
    else {
      cmsys::SystemTools::UpperCase(&mapProp,s_00);
      pcVar1 = local_108;
      impProp._M_dataplus._M_p._0_1_ = 0x5f;
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                (&locProp,&locPropBase,(char *)&impProp,&mapProp);
      cVar3 = GetProperty(pcVar1,&locProp);
      loc->Value = (string *)cVar3;
      if ((char)local_114 != '\0') {
        cmStrCat<char_const(&)[17],std::__cxx11::string&>
                  (&impProp,(char (*) [17])"IMPORTED_IMPLIB_",&mapProp);
        cVar3 = GetProperty(pcVar1,&impProp);
        local_110->Value = cVar3.Value;
        std::__cxx11::string::~string((string *)&impProp);
        cVar3 = (cmValue)loc->Value;
      }
      if (cVar3.Value != (string *)0x0 || local_110->Value != (string *)0x0) {
        local_115 = '_';
        cmStrCat<char,std::__cxx11::string&>(&impProp,&local_115,&mapProp);
        std::__cxx11::string::operator=((string *)local_100,(string *)&impProp);
        std::__cxx11::string::~string((string *)&impProp);
      }
      std::__cxx11::string::~string((string *)&locProp);
      std::__cxx11::string::~string((string *)&mapProp);
    }
    s_00 = s_00 + 1;
  } while( true );
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  cmList mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      mappedConfigs.assign(*mapValue, cmList::EmptyElements::Yes);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // There may be only IMPORTED_IMPLIB for a shared library or an executable
  // with exports.
  bool allowImp = (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->GetMakefile()->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    cmList availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      availableConfigs.assign(*iconfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}